

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_send(CURL *curl,void *buffer,size_t buflen,size_t *n)

{
  SessionHandle *data;
  connectdata *c;
  ssize_t n1;
  CURLcode ret;
  curl_socket_t sfd;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  CURL *curl_local;
  
  data = (SessionHandle *)0x0;
  _ret = n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = curl;
  n1._0_4_ = easy_connection((SessionHandle *)curl,(curl_socket_t *)((long)&n1 + 4),
                             (connectdata **)&data);
  curl_local._4_4_ = (CURLcode)n1;
  if ((CURLcode)n1 == CURLE_OK) {
    *_ret = 0;
    curl_local._4_4_ =
         Curl_write((connectdata *)data,n1._4_4_,(void *)buflen_local,(size_t)n_local,(ssize_t *)&c)
    ;
    if (c == (connectdata *)0xffffffffffffffff) {
      curl_local._4_4_ = CURLE_SEND_ERROR;
    }
    else if ((curl_local._4_4_ == CURLE_OK) && (c == (connectdata *)0x0)) {
      curl_local._4_4_ = CURLE_AGAIN;
    }
    else {
      *_ret = (size_t)c;
    }
  }
  return curl_local._4_4_;
}

Assistant:

CURLcode curl_easy_send(CURL *curl, const void *buffer, size_t buflen,
                        size_t *n)
{
  curl_socket_t sfd;
  CURLcode ret;
  ssize_t n1;
  struct connectdata *c = NULL;
  struct SessionHandle *data = (struct SessionHandle *)curl;

  ret = easy_connection(data, &sfd, &c);
  if(ret)
    return ret;

  *n = 0;
  ret = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if((CURLE_OK == ret) && (0 == n1))
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return ret;
}